

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::CloneString(char *str,size_t length)

{
  char *clone;
  size_t length_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    str_local = (char *)operator_new__(length + 1);
    posix::StrNCpy(str_local,str,length);
    str_local[length] = '\0';
  }
  return str_local;
}

Assistant:

static char* CloneString(const char* str, size_t length) {
  if (str == NULL) {
    return NULL;
  } else {
    char* const clone = new char[length + 1];
    posix::StrNCpy(clone, str, length);
    clone[length] = '\0';
    return clone;
  }
}